

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned.h
# Opt level: O2

void __thiscall fasttext::DenseMatrix::zero(DenseMatrix *this)

{
  float *pfVar1;
  size_t sVar2;
  long lVar3;
  
  pfVar1 = (this->data_).mem_;
  sVar2 = (this->data_).size_;
  for (lVar3 = 0; sVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)pfVar1 + lVar3) = 0;
  }
  return;
}

Assistant:

T *begin() { return mem_; }